

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiff_io.cc
# Opt level: O0

void gimage::anon_unknown_6::readUnpacked<unsigned_short>
               (unsigned_short *ret,uint32_t n,TiffImage<unsigned_short> *tif,uint32_t row,
               uint16_t sample)

{
  int iVar1;
  uchar *puVar2;
  undefined8 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  undefined4 in_ECX;
  undefined8 *in_RDX;
  uint in_ESI;
  ulong uVar5;
  long in_RDI;
  undefined2 in_R8W;
  size_t i_12;
  size_t i_11;
  uint32_t *p_7;
  size_t i_10;
  size_t i_9;
  uint16_t *p_6;
  size_t i_8;
  size_t i_7;
  uint8_t *p_5;
  size_t i_6;
  uint8_t *p_4;
  size_t i_5;
  uint8_t *p_3;
  size_t i_4;
  uint8_t *p_2;
  uint32_t i_3;
  uint32_t i_2;
  double *p_1;
  uint32_t i_1;
  uint32_t i;
  float *p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd88;
  size_type in_stack_fffffffffffffd98;
  undefined7 in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffda7;
  uint in_stack_fffffffffffffdac;
  string *in_stack_fffffffffffffdb8;
  IOException *in_stack_fffffffffffffdc0;
  int in_stack_fffffffffffffdcc;
  ulong local_190;
  ulong local_188;
  ulong local_178;
  ulong local_170;
  ulong local_160;
  ulong local_158;
  ulong local_148;
  byte *local_140;
  ulong local_138;
  byte *local_130;
  ulong local_128;
  byte *local_120;
  uint local_b0;
  uint local_ac;
  uint local_a0;
  uint local_9c;
  
  if ((((*(short *)((long)in_RDX + 0x12) == 0x10) && ((*(byte *)((long)in_RDX + 0x14) & 1) == 0)) &&
      ((ulong)in_RDX[3] <= (ulong)in_ESI << 1)) && (*(short *)(in_RDX + 4) != 0)) {
    iVar1 = TIFFReadScanline(*in_RDX,in_RDI,in_ECX,in_R8W);
    if (iVar1 < 0) {
      uVar3 = __cxa_allocate_exception(0x28);
      std::__cxx11::to_string(in_stack_fffffffffffffdac);
      std::operator+((char *)in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
      std::operator+(in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
      gutil::IOException::IOException(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      __cxa_throw(uVar3,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
    }
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
               in_stack_fffffffffffffd98);
    uVar3 = *in_RDX;
    puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1a46c3);
    iVar1 = TIFFReadScanline(uVar3,puVar2,in_ECX,in_R8W);
    if (iVar1 < 0) {
      uVar3 = __cxa_allocate_exception(0x28);
      std::__cxx11::to_string(in_stack_fffffffffffffdac);
      std::operator+((char *)in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
      std::operator+(in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
      gutil::IOException::IOException(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      __cxa_throw(uVar3,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
    }
    if ((*(byte *)((long)in_RDX + 0x14) & 1) == 0) {
      if (*(short *)((long)in_RDX + 0x12) == 1) {
        local_120 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1a4bb0);
        local_128 = 0;
        if (*(short *)(in_RDX + 4) == 0) {
          while (local_128 < in_ESI) {
            uVar5 = local_128 + 1;
            *(short *)(in_RDI + local_128 * 2) = 1 - (short)((int)(uint)*local_120 >> 7);
            if (uVar5 < in_ESI) {
              *(ushort *)(in_RDI + uVar5 * 2) = 1 - ((ushort)((int)(uint)*local_120 >> 6) & 1);
              uVar5 = local_128 + 2;
            }
            local_128 = uVar5;
            if (local_128 < in_ESI) {
              *(ushort *)(in_RDI + local_128 * 2) = 1 - ((ushort)((int)(uint)*local_120 >> 5) & 1);
              local_128 = local_128 + 1;
            }
            if (local_128 < in_ESI) {
              *(ushort *)(in_RDI + local_128 * 2) = 1 - ((ushort)((int)(uint)*local_120 >> 4) & 1);
              local_128 = local_128 + 1;
            }
            if (local_128 < in_ESI) {
              *(ushort *)(in_RDI + local_128 * 2) = 1 - ((ushort)((int)(uint)*local_120 >> 3) & 1);
              local_128 = local_128 + 1;
            }
            if (local_128 < in_ESI) {
              *(ushort *)(in_RDI + local_128 * 2) = 1 - ((ushort)((int)(uint)*local_120 >> 2) & 1);
              local_128 = local_128 + 1;
            }
            if (local_128 < in_ESI) {
              *(ushort *)(in_RDI + local_128 * 2) = 1 - ((ushort)((int)(uint)*local_120 >> 1) & 1);
              local_128 = local_128 + 1;
            }
            if (local_128 < in_ESI) {
              *(ushort *)(in_RDI + local_128 * 2) = 1 - (*local_120 & 1);
              local_128 = local_128 + 1;
            }
            local_120 = local_120 + 1;
          }
        }
        else {
          while (local_128 < in_ESI) {
            uVar5 = local_128 + 1;
            *(short *)(in_RDI + local_128 * 2) = (short)((int)(uint)*local_120 >> 7);
            if (uVar5 < in_ESI) {
              *(ushort *)(in_RDI + uVar5 * 2) = (ushort)((int)(uint)*local_120 >> 6) & 1;
              uVar5 = local_128 + 2;
            }
            local_128 = uVar5;
            if (local_128 < in_ESI) {
              *(ushort *)(in_RDI + local_128 * 2) = (ushort)((int)(uint)*local_120 >> 5) & 1;
              local_128 = local_128 + 1;
            }
            if (local_128 < in_ESI) {
              *(ushort *)(in_RDI + local_128 * 2) = (ushort)((int)(uint)*local_120 >> 4) & 1;
              local_128 = local_128 + 1;
            }
            if (local_128 < in_ESI) {
              *(ushort *)(in_RDI + local_128 * 2) = (ushort)((int)(uint)*local_120 >> 3) & 1;
              local_128 = local_128 + 1;
            }
            if (local_128 < in_ESI) {
              *(ushort *)(in_RDI + local_128 * 2) = (ushort)((int)(uint)*local_120 >> 2) & 1;
              local_128 = local_128 + 1;
            }
            if (local_128 < in_ESI) {
              *(ushort *)(in_RDI + local_128 * 2) = (ushort)((int)(uint)*local_120 >> 1) & 1;
              local_128 = local_128 + 1;
            }
            if (local_128 < in_ESI) {
              *(ushort *)(in_RDI + local_128 * 2) = *local_120 & 1;
              local_128 = local_128 + 1;
            }
            local_120 = local_120 + 1;
          }
        }
      }
      else if (*(short *)((long)in_RDX + 0x12) == 2) {
        local_130 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1a5129);
        local_138 = 0;
        if (*(short *)(in_RDX + 4) == 0) {
          while (local_138 < in_ESI) {
            uVar5 = local_138 + 1;
            *(short *)(in_RDI + local_138 * 2) = 3 - (short)((int)(uint)*local_130 >> 6);
            if (uVar5 < in_ESI) {
              *(ushort *)(in_RDI + uVar5 * 2) = 3 - ((ushort)((int)(uint)*local_130 >> 4) & 3);
              uVar5 = local_138 + 2;
            }
            local_138 = uVar5;
            if (local_138 < in_ESI) {
              *(ushort *)(in_RDI + local_138 * 2) = 3 - ((ushort)((int)(uint)*local_130 >> 2) & 3);
              local_138 = local_138 + 1;
            }
            if (local_138 < in_ESI) {
              *(ushort *)(in_RDI + local_138 * 2) = 3 - (*local_130 & 3);
              local_138 = local_138 + 1;
            }
            local_130 = local_130 + 1;
          }
        }
        else {
          while (local_138 < in_ESI) {
            uVar5 = local_138 + 1;
            *(short *)(in_RDI + local_138 * 2) = (short)((int)(uint)*local_130 >> 6);
            if (uVar5 < in_ESI) {
              *(ushort *)(in_RDI + uVar5 * 2) = (ushort)((int)(uint)*local_130 >> 4) & 3;
              uVar5 = local_138 + 2;
            }
            local_138 = uVar5;
            if (local_138 < in_ESI) {
              *(ushort *)(in_RDI + local_138 * 2) = (ushort)((int)(uint)*local_130 >> 2) & 3;
              local_138 = local_138 + 1;
            }
            if (local_138 < in_ESI) {
              *(ushort *)(in_RDI + local_138 * 2) = *local_130 & 3;
              local_138 = local_138 + 1;
            }
            local_130 = local_130 + 1;
          }
        }
      }
      else if (*(short *)((long)in_RDX + 0x12) == 4) {
        local_140 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1a5430);
        local_148 = 0;
        if (*(short *)(in_RDX + 4) == 0) {
          while (local_148 < in_ESI) {
            uVar5 = local_148 + 1;
            *(short *)(in_RDI + local_148 * 2) = 0xf - (short)((int)(uint)*local_140 >> 4);
            if (uVar5 < in_ESI) {
              *(ushort *)(in_RDI + uVar5 * 2) = 0xf - (*local_140 & 0xf);
              uVar5 = local_148 + 2;
            }
            local_148 = uVar5;
            local_140 = local_140 + 1;
          }
        }
        else {
          while (local_148 < in_ESI) {
            uVar5 = local_148 + 1;
            *(short *)(in_RDI + local_148 * 2) = (short)((int)(uint)*local_140 >> 4);
            if (uVar5 < in_ESI) {
              *(ushort *)(in_RDI + uVar5 * 2) = *local_140 & 0xf;
              uVar5 = local_148 + 2;
            }
            local_148 = uVar5;
            local_140 = local_140 + 1;
          }
        }
      }
      else if (*(short *)((long)in_RDX + 0x12) == 8) {
        puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1a55fd);
        if (*(short *)(in_RDX + 4) == 0) {
          for (local_158 = 0; local_158 < in_ESI; local_158 = local_158 + 1) {
            *(ushort *)(in_RDI + local_158 * 2) = 0xff - (ushort)puVar2[local_158];
          }
        }
        else {
          for (local_160 = 0; local_160 < in_ESI; local_160 = local_160 + 1) {
            *(ushort *)(in_RDI + local_160 * 2) = (ushort)puVar2[local_160];
          }
        }
      }
      else if (*(short *)((long)in_RDX + 0x12) == 0x10) {
        puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1a570e);
        if (*(short *)(in_RDX + 4) == 0) {
          for (local_170 = 0; local_170 < in_ESI; local_170 = local_170 + 1) {
            *(short *)(in_RDI + local_170 * 2) = -1 - *(short *)(puVar2 + local_170 * 2);
          }
        }
        else {
          for (local_178 = 0; local_178 < in_ESI; local_178 = local_178 + 1) {
            *(undefined2 *)(in_RDI + local_178 * 2) = *(undefined2 *)(puVar2 + local_178 * 2);
          }
        }
      }
      else {
        if (*(short *)((long)in_RDX + 0x12) != 0x20) {
          pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __cxa_allocate_exception(0x28);
          std::__cxx11::to_string(in_stack_fffffffffffffdcc);
          std::operator+((char *)in_stack_fffffffffffffd88,pbVar4);
          std::operator+(in_stack_fffffffffffffd88,(char *)pbVar4);
          gutil::IOException::IOException(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
          __cxa_throw(pbVar4,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
        }
        puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1a581c);
        if (*(short *)(in_RDX + 4) == 0) {
          for (local_188 = 0; local_188 < in_ESI; local_188 = local_188 + 1) {
            *(short *)(in_RDI + local_188 * 2) = -1 - (short)*(undefined4 *)(puVar2 + local_188 * 4)
            ;
          }
        }
        else {
          for (local_190 = 0; local_190 < in_ESI; local_190 = local_190 + 1) {
            *(short *)(in_RDI + local_190 * 2) = (short)*(undefined4 *)(puVar2 + local_190 * 4);
          }
        }
      }
    }
    else if (*(short *)((long)in_RDX + 0x12) == 0x20) {
      puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1a485a);
      if (*(short *)(in_RDX + 4) == 0) {
        for (local_9c = 0; local_9c < in_ESI; local_9c = local_9c + 1) {
          *(short *)(in_RDI + (ulong)local_9c * 2) =
               (short)(int)(1.0 - *(float *)(puVar2 + (ulong)local_9c * 4));
        }
      }
      else {
        for (local_a0 = 0; local_a0 < in_ESI; local_a0 = local_a0 + 1) {
          *(short *)(in_RDI + (ulong)local_a0 * 2) =
               (short)(int)*(float *)(puVar2 + (ulong)local_a0 * 4);
        }
      }
    }
    else {
      if (*(short *)((long)in_RDX + 0x12) != 0x40) {
        pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __cxa_allocate_exception(0x28);
        std::__cxx11::to_string(in_stack_fffffffffffffdcc);
        std::operator+((char *)pbVar4,in_stack_fffffffffffffd80);
        std::operator+(pbVar4,(char *)in_stack_fffffffffffffd80);
        gutil::IOException::IOException(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
        __cxa_throw(pbVar4,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
      }
      puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1a4962);
      if (*(short *)(in_RDX + 4) == 0) {
        for (local_ac = 0; local_ac < in_ESI; local_ac = local_ac + 1) {
          *(short *)(in_RDI + (ulong)local_ac * 2) =
               (short)(int)(1.0 - *(double *)(puVar2 + (ulong)local_ac * 8));
        }
      }
      else {
        for (local_b0 = 0; local_b0 < in_ESI; local_b0 = local_b0 + 1) {
          *(short *)(in_RDI + (ulong)local_b0 * 2) =
               (short)(int)*(double *)(puVar2 + (ulong)local_b0 * 8);
        }
      }
    }
  }
  return;
}

Assistant:

void readUnpacked(T *ret, uint32_t n, TiffImage<T> &tif, uint32_t row, uint16_t sample)
{
  if (tif.bits != 8*sizeof(T) || tif.is_float != std::is_floating_point<T>::value ||
    n*sizeof(T) < tif.raw_size || tif.photometric == PHOTOMETRIC_MINISWHITE)
  {
    // converting row value wise

    tif.raw.resize(tif.raw_size);

    if (TIFFReadScanline(tif.tif, tif.raw.data(), row, sample) < 0)
    {
      throw gutil::IOException("Cannot read row "+std::to_string(row)+" of TIFF image");
    }

    if (tif.is_float)
    {
      if (tif.bits == 32)
      {
        float *p=reinterpret_cast<float *>(tif.raw.data());

        if (tif.photometric == PHOTOMETRIC_MINISWHITE)
        {
          for (uint32_t i=0; i<n; i++) ret[i]=static_cast<T>(1.0f-p[i]);
        }
        else
        {
          for (uint32_t i=0; i<n; i++) ret[i]=static_cast<T>(p[i]);
        }
      }
      else if (tif.bits == 64)
      {
        double *p=reinterpret_cast<double *>(tif.raw.data());

        if (tif.photometric == PHOTOMETRIC_MINISWHITE)
        {
          for (uint32_t i=0; i<n; i++) ret[i]=static_cast<T>(1.0-p[i]);
        }
        else
        {
          for (uint32_t i=0; i<n; i++) ret[i]=static_cast<T>(p[i]);
        }
      }
      else
      {
        throw gutil::IOException("Cannot convert TIFF image with "+std::to_string(tif.bits)+" bit floating point type");
      }
    }
    else
    {
      if (tif.bits == 1)
      {
        uint8_t *p=reinterpret_cast<uint8_t *>(tif.raw.data());

        size_t i=0;
        if (tif.photometric == PHOTOMETRIC_MINISWHITE)
        {
          while (i < n)
          {
            ret[i++]=static_cast<T>(1-((*p>>7) & 0x1));
            if (i < n) ret[i++]=static_cast<T>(1-((*p>>6) & 0x1));
            if (i < n) ret[i++]=static_cast<T>(1-((*p>>5) & 0x1));
            if (i < n) ret[i++]=static_cast<T>(1-((*p>>4) & 0x1));
            if (i < n) ret[i++]=static_cast<T>(1-((*p>>3) & 0x1));
            if (i < n) ret[i++]=static_cast<T>(1-((*p>>2) & 0x1));
            if (i < n) ret[i++]=static_cast<T>(1-((*p>>1) & 0x1));
            if (i < n) ret[i++]=static_cast<T>(1-(*p & 0x1));
            p++;
          }
        }
        else
        {
          while (i < n)
          {
            ret[i++]=static_cast<T>((*p>>7) & 0x1);
            if (i < n) ret[i++]=static_cast<T>((*p>>6) & 0x1);
            if (i < n) ret[i++]=static_cast<T>((*p>>5) & 0x1);
            if (i < n) ret[i++]=static_cast<T>((*p>>4) & 0x1);
            if (i < n) ret[i++]=static_cast<T>((*p>>3) & 0x1);
            if (i < n) ret[i++]=static_cast<T>((*p>>2) & 0x1);
            if (i < n) ret[i++]=static_cast<T>((*p>>1) & 0x1);
            if (i < n) ret[i++]=static_cast<T>(*p & 0x1);
            p++;
          }
        }
      }
      else if (tif.bits == 2)
      {
        uint8_t *p=reinterpret_cast<uint8_t *>(tif.raw.data());

        size_t i=0;
        if (tif.photometric == PHOTOMETRIC_MINISWHITE)
        {
          while (i < n)
          {
            ret[i++]=static_cast<T>(3-((*p>>6) & 0x3));
            if (i < n) ret[i++]=static_cast<T>(3-((*p>>4) & 0x3));
            if (i < n) ret[i++]=static_cast<T>(3-((*p>>2) & 0x3));
            if (i < n) ret[i++]=static_cast<T>(3-(*p & 0x3));
            p++;
          }
        }
        else
        {
          while (i < n)
          {
            ret[i++]=static_cast<T>((*p>>6) & 0x3);
            if (i < n) ret[i++]=static_cast<T>((*p>>4) & 0x3);
            if (i < n) ret[i++]=static_cast<T>((*p>>2) & 0x3);
            if (i < n) ret[i++]=static_cast<T>(*p & 0x3);
            p++;
          }
        }
      }
      else if (tif.bits == 4)
      {
        uint8_t *p=reinterpret_cast<uint8_t *>(tif.raw.data());

        size_t i=0;
        if (tif.photometric == PHOTOMETRIC_MINISWHITE)
        {
          while (i < n)
          {
            ret[i++]=static_cast<T>(15-((*p>>4) & 0xf));
            if (i < n) ret[i++]=static_cast<T>(15-(*p & 0xf));
            p++;
          }
        }
        else
        {
          while (i < n)
          {
            ret[i++]=static_cast<T>((*p>>4) & 0xf);
            if (i < n) ret[i++]=static_cast<T>(*p & 0xf);
            p++;
          }
        }
      }
      else if (tif.bits == 8)
      {
        uint8_t *p=reinterpret_cast<uint8_t *>(tif.raw.data());
        if (tif.photometric == PHOTOMETRIC_MINISWHITE)
        {
          for (size_t i=0; i<n; i++) ret[i]=static_cast<T>(255-p[i]);
        }
        else
        {
          for (size_t i=0; i<n; i++) ret[i]=static_cast<T>(p[i]);
        }
      }
      else if (tif.bits == 16)
      {
        uint16_t *p=reinterpret_cast<uint16_t *>(tif.raw.data());
        if (tif.photometric == PHOTOMETRIC_MINISWHITE)
        {
          for (size_t i=0; i<n; i++) ret[i]=static_cast<T>(65535-p[i]);
        }
        else
        {
          for (size_t i=0; i<n; i++) ret[i]=static_cast<T>(p[i]);
        }
      }
      else if (tif.bits == 32)
      {
        uint32_t *p=reinterpret_cast<uint32_t *>(tif.raw.data());
        if (tif.photometric == PHOTOMETRIC_MINISWHITE)
        {
          for (size_t i=0; i<n; i++) ret[i]=static_cast<T>(4294967295-p[i]);
        }
        else
        {
          for (size_t i=0; i<n; i++) ret[i]=static_cast<T>(p[i]);
        }
      }
      else
      {
        throw gutil::IOException("Cannot convert TIFF image with "+std::to_string(tif.bits)+" bit integer type");
      }
    }
  }
  else
  {
    if (TIFFReadScanline(tif.tif, ret, row, sample) < 0)
    {
      throw gutil::IOException("Cannot read row "+std::to_string(row)+" of TIFF image");
    }
  }
}